

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O0

bool isFatalCountDown(char *varname,QBasicAtomicInt *n)

{
  bool bVar1;
  int iVar2;
  QBasicAtomicInteger<int> *in_RSI;
  long in_FS_OFFSET;
  int env;
  int v;
  uint in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  bool local_d;
  char *varname_00;
  
  varname_00 = *(char **)(in_FS_OFFSET + 0x28);
  iVar2 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x2482f6);
  if (iVar2 == 0) {
    in_stack_ffffffffffffffdc = checked_var_value(varname_00);
    in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc + 1;
    if (in_stack_ffffffffffffffdc == 1) {
      QBasicAtomicInteger<int>::storeRelaxed(in_RSI,1);
      local_d = false;
      goto LAB_002483b8;
    }
    if (in_stack_ffffffffffffffdc == 2) {
      local_d = true;
      goto LAB_002483b8;
    }
    bVar1 = QBasicAtomicInteger<int>::testAndSetRelaxed
                      (in_RSI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,(int *)0x248358);
    if (bVar1) {
      local_d = false;
      goto LAB_002483b8;
    }
  }
  do {
    in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 & 0xffffff;
    if (2 < iVar2) {
      bVar1 = QBasicAtomicInteger<int>::testAndSetRelaxed
                        (in_RSI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,(int *)0x248396)
      ;
      in_stack_ffffffffffffffd8 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffd8) ^ 0xff000000;
    }
  } while ((in_stack_ffffffffffffffd8 & 0x1000000) != 0);
  local_d = iVar2 == 2;
LAB_002483b8:
  if (*(char **)(in_FS_OFFSET + 0x28) != varname_00) {
    __stack_chk_fail();
  }
  return local_d;
}

Assistant:

static bool isFatalCountDown(const char *varname, QBasicAtomicInt &n)
{
    static const int Uninitialized = 0;
    static const int NeverFatal = 1;
    static const int ImmediatelyFatal = 2;

    int v = n.loadRelaxed();
    if (v == Uninitialized) {
        // first, initialize from the environment
        // note that the atomic stores the env.var value plus 1, so adjust
        const int env = checked_var_value(varname) + 1;
        if (env == NeverFatal) {
            // not fatal, now or in the future, so use a fast path
            n.storeRelaxed(NeverFatal);
            return false;
        } else if (env == ImmediatelyFatal) {
            return true;
        } else if (n.testAndSetRelaxed(Uninitialized, env - 1, v)) {
            return false;       // not yet fatal, but decrement
        } else {
            // some other thread initialized before we did
        }
    }

    while (v > ImmediatelyFatal && !n.testAndSetRelaxed(v, v - 1, v))
        qYieldCpu();

    // We exited the loop, so either v already was ImmediatelyFatal or we
    // succeeded to set n from v to v-1.
    return v == ImmediatelyFatal;
}